

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader15.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader15::begin__IDREF_array
          (LibraryControllersLoader15 *this,IDREF_array__AttributeData *attributeData)

{
  int iVar1;
  bool bVar2;
  uint local_20 [2];
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  uint64 local_8;
  
  local_18 = *(undefined4 *)&attributeData->id;
  uStack_14 = *(undefined4 *)((long)&attributeData->id + 4);
  uStack_10 = *(undefined4 *)&attributeData->name;
  uStack_c = *(undefined4 *)((long)&attributeData->name + 4);
  bVar2 = (attributeData->present_attributes & 1) != 0;
  if (bVar2) {
    local_8 = attributeData->count;
  }
  local_20[0] = (uint)bVar2;
  iVar1 = (*(this->mLoader->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.
            super_ExtraDataLoader._vptr_ExtraDataLoader[0x2e])(this->mLoader,local_20);
  return SUB41(iVar1,0);
}

Assistant:

bool LibraryControllersLoader15::begin__IDREF_array( const COLLADASaxFWL15::IDREF_array__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__IDREF_array(attributeData));
COLLADASaxFWL::IDREF_array__AttributeData attrData;
attrData.present_attributes = 0;
attrData.id = attributeData.id;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::IDREF_array__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL15::IDREF_array__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::IDREF_array__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__IDREF_array(attrData);
}